

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O2

int archive_write_zip_header(archive_write *a,archive_entry *entry)

{
  byte *pbVar1;
  char cVar2;
  uint32_t uVar3;
  zip_conflict *zip;
  uchar uVar4;
  size_t sVar5;
  uchar uVar6;
  mode_t mVar7;
  wchar_t wVar8;
  int iVar9;
  mode_t mVar10;
  uint uVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  uchar *pp;
  archive_string_conv *sc;
  la_int64_t lVar14;
  unsigned_long uVar15;
  archive_entry *paVar16;
  int *piVar17;
  char *pcVar18;
  size_t sVar19;
  size_t sVar20;
  undefined1 (*pauVar21) [16];
  uchar *puVar22;
  time_t tVar23;
  undefined4 uVar24;
  char *pcVar25;
  long lVar26;
  int64_t iVar27;
  undefined2 uVar28;
  compression cVar29;
  uchar *p_1;
  uchar *puVar30;
  size_t sVar31;
  uchar uVar32;
  undefined4 uVar33;
  uchar *zip64_start;
  uint uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined4 in_stack_fffffffffffffee8;
  int iVar37;
  char *local_110;
  size_t len;
  undefined1 local_100;
  undefined1 local_ff;
  uint local_fe;
  undefined2 local_fa;
  undefined2 uStack_f8;
  undefined4 uStack_f6;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  uchar uStack_ee;
  uchar uStack_ed;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  int64_t *local_e0;
  archive_write *local_d8;
  size_t local_d0;
  uchar local_extra [144];
  
  zip = (zip_conflict *)a->format_data;
  sc = zip->opt_sconv;
  if (sc == (archive_string_conv *)0x0) {
    if (zip->init_default_conversion == 0) {
      sc = archive_string_default_conversion_for_write(&a->archive);
      zip->sconv_default = sc;
      zip->init_default_conversion = 1;
    }
    else {
      sc = zip->sconv_default;
    }
  }
  mVar7 = archive_entry_filetype(entry);
  if (((mVar7 != 0x4000) && (mVar7 != 0x8000)) && (mVar7 != 0xa000)) {
    __archive_write_entry_filetype_unsupported(&a->archive,entry,"zip");
    return -0x19;
  }
  if ((zip->flags & 1) != 0) {
    wVar8 = archive_entry_size_is_set(entry);
    if ((wVar8 != L'\0') && (lVar14 = archive_entry_size(entry), 0xffffffff < lVar14)) {
      pcVar25 = "Files > 4GB require Zip64 extensions";
LAB_004ab887:
      archive_set_error(&a->archive,-1,pcVar25);
      return -0x19;
    }
    if (0xffffffff < zip->written_bytes) {
      pcVar25 = "Archives > 4GB require Zip64 extensions";
      goto LAB_004ab887;
    }
  }
  if (mVar7 != 0x8000) {
    archive_entry_set_size(entry,0);
  }
  zip->entry_offset = zip->written_bytes;
  zip->entry_uncompressed_limit = 0x7fffffffffffffff;
  zip->entry_flags = 0;
  zip->entry_uses_zip64 = 0;
  zip->entry_compressed_size = 0;
  zip->entry_uncompressed_size = 0;
  zip->entry_compressed_written = 0;
  zip->entry_uncompressed_written = 0;
  uVar15 = (*zip->crc32func)(0,(void *)0x0,0);
  zip->entry_crc32 = (uint32_t)uVar15;
  zip->entry_encryption = ENCRYPTION_NONE;
  archive_entry_free(zip->entry);
  zip->entry = (archive_entry *)0x0;
  if (zip->cctx_valid != '\0') {
    aes_ctr_release(&zip->cctx);
  }
  if (zip->hctx_valid != '\0') {
    __hmac_sha1_cleanup(&zip->hctx);
  }
  zip->hctx_valid = '\0';
  zip->cctx_valid = '\0';
  zip->tctx_valid = '\0';
  if (((mVar7 == 0x8000) &&
      ((wVar8 = archive_entry_size_is_set(entry), wVar8 == L'\0' ||
       (lVar14 = archive_entry_size(entry), 0 < lVar14)))) &&
     (zip->encryption_type - ENCRYPTION_TRADITIONAL < 3)) {
    *(byte *)&zip->entry_flags = (byte)zip->entry_flags | 1;
    zip->entry_encryption = zip->encryption_type;
  }
  paVar16 = archive_entry_clone(entry);
  zip->entry = paVar16;
  if (paVar16 == (archive_entry *)0x0) {
    pcVar25 = "Can\'t allocate zip header data";
  }
  else {
    if (sc == (archive_string_conv *)0x0) {
      iVar37 = 0;
    }
    else {
      wVar8 = _archive_entry_pathname_l(entry,(char **)local_extra,&len,sc);
      if (wVar8 == L'\0') {
        iVar37 = 0;
      }
      else {
        piVar17 = __errno_location();
        if (*piVar17 == 0xc) {
          pcVar25 = "Can\'t allocate memory for Pathname";
          goto LAB_004ab9e3;
        }
        pcVar25 = archive_entry_pathname(entry);
        pcVar18 = archive_string_conversion_charset_name(sc);
        archive_set_error(&a->archive,0x54,"Can\'t translate Pathname \'%s\' to %s",pcVar25,pcVar18)
        ;
        iVar37 = -0x14;
      }
      if (CONCAT26(len._6_2_,CONCAT15(len._5_1_,CONCAT14(len._4_1_,(undefined4)len))) != 0) {
        archive_entry_set_pathname
                  (zip->entry,
                   (char *)CONCAT44(local_extra._4_4_,
                                    CONCAT13(local_extra[3],
                                             CONCAT12(local_extra[2],local_extra._0_2_))));
      }
      if (mVar7 == 0xa000) {
        wVar8 = _archive_entry_symlink_l(entry,(char **)local_extra,&len,sc);
        if (wVar8 == L'\0') {
          if (CONCAT26(len._6_2_,CONCAT15(len._5_1_,CONCAT14(len._4_1_,(undefined4)len))) != 0) {
            archive_entry_set_symlink
                      (zip->entry,
                       (char *)CONCAT44(local_extra._4_4_,
                                        CONCAT13(local_extra[3],
                                                 CONCAT12(local_extra[2],local_extra._0_2_))));
          }
        }
        else {
          piVar17 = __errno_location();
          if (*piVar17 == 0xc) {
            pcVar25 = "Can\'t allocate memory  for Symlink";
            goto LAB_004ab9e3;
          }
        }
      }
      paVar16 = zip->entry;
    }
    local_e0 = &zip->entry_compressed_size;
    pcVar25 = archive_entry_pathname(paVar16);
    do {
      cVar2 = *pcVar25;
      if (cVar2 == '\0') goto LAB_004abaf6;
      pcVar25 = pcVar25 + 1;
    } while (-1 < cVar2);
    if (zip->opt_sconv == (archive_string_conv *)0x0) {
      pcVar25 = nl_langinfo(0xe);
    }
    else {
      pcVar25 = archive_string_conversion_charset_name(zip->opt_sconv);
    }
    iVar9 = strcmp(pcVar25,"UTF-8");
    if (iVar9 == 0) {
      pbVar1 = (byte *)((long)&zip->entry_flags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
LAB_004abaf6:
    paVar16 = zip->entry;
    local_d8 = a;
    mVar10 = archive_entry_filetype(paVar16);
    pcVar25 = archive_entry_pathname(paVar16);
    if (pcVar25 == (char *)0x0) {
      sVar19 = 0;
    }
    else {
      sVar19 = strlen(pcVar25);
      if ((mVar10 == 0x4000) && ((*pcVar25 == '\0' || (pcVar25[sVar19 - 1] != '/')))) {
        sVar19 = sVar19 + 1;
      }
    }
    uVar33 = 0x14;
    if (mVar7 == 0xa000) {
      local_110 = archive_entry_symlink(zip->entry);
      uVar28 = 0;
      if (local_110 == (char *)0x0) {
        sVar20 = 0;
      }
      else {
        sVar20 = strlen(local_110);
      }
      zip->entry_uncompressed_limit = sVar20;
      zip->entry_compressed_size = sVar20;
      zip->entry_uncompressed_size = sVar20;
      uVar15 = (*zip->crc32func)((unsigned_long)zip->entry_crc32,local_110,sVar20);
      zip->entry_crc32 = (uint32_t)uVar15;
      zip->entry_compression = COMPRESSION_STORE;
    }
    else {
      if (mVar7 == 0x8000) {
        wVar8 = archive_entry_size_is_set(zip->entry);
        cVar29 = COMPRESSION_DEFLATE;
        if (wVar8 == L'\0') {
          uVar11 = zip->entry_flags;
          if (zip->requested_compression != COMPRESSION_UNSPECIFIED) {
            cVar29 = zip->requested_compression;
          }
          zip->entry_compression = cVar29;
          zip->entry_flags = uVar11 | 8;
          if ((zip->flags & 1) == 0) {
            zip->entry_uses_zip64 = 1;
            uVar24 = 0x2d;
            uVar33 = uVar24;
          }
          else {
            uVar24 = 0x14;
            uVar33 = 10;
            if (cVar29 != COMPRESSION_STORE) {
              uVar33 = uVar24;
            }
          }
          if (((uVar11 & 1) != 0) && (zip->entry_encryption - ENCRYPTION_TRADITIONAL < 3)) {
            uVar33 = uVar24;
          }
        }
        else {
          lVar14 = archive_entry_size(zip->entry);
          zip->entry_uncompressed_limit = lVar14;
          if (zip->requested_compression != COMPRESSION_UNSPECIFIED) {
            cVar29 = zip->requested_compression;
          }
          zip->entry_compression = cVar29;
          if (cVar29 == COMPRESSION_STORE) {
            uVar33 = 10;
            *local_e0 = lVar14;
          }
          else {
            uVar33 = 0x14;
          }
          zip->entry_uncompressed_size = lVar14;
          uVar11 = zip->entry_flags;
          if ((uVar11 & 1) == 0) {
            lVar26 = 0;
          }
          else {
            uVar34 = zip->entry_encryption - ENCRYPTION_TRADITIONAL;
            if (uVar34 < 3) {
              uVar33 = 0x14;
            }
            lVar26 = 0;
            if (uVar34 < 3) {
              lVar26 = (ulong)uVar34 * 8 + 0xc;
            }
            if (cVar29 == COMPRESSION_STORE) {
              *local_e0 = *local_e0 + lVar26;
            }
          }
          if ((((zip->flags & 2) != 0) || (0xffffffff < lVar26 + lVar14)) ||
             (0xff000000 < lVar14 && cVar29 != COMPRESSION_STORE)) {
            uVar33 = 0x2d;
            zip->entry_uses_zip64 = 1;
          }
          zip->entry_flags = uVar11 | 8;
        }
      }
      else {
        zip->entry_compression = COMPRESSION_STORE;
        zip->entry_uncompressed_limit = 0;
        cVar29 = COMPRESSION_STORE;
      }
      uVar28 = (undefined2)cVar29;
      sVar20 = 0;
      local_110 = (char *)0x0;
    }
    uStack_f8 = 0;
    uStack_f6 = 0;
    uStack_f2 = 0;
    uStack_f1 = 0;
    uStack_f0 = 0;
    uStack_ef = 0;
    uStack_ee = 0;
    uStack_ed = 0;
    uStack_ec = 0;
    uStack_ea = 0;
    len._0_4_ = 0x4034b50;
    uVar32 = (uchar)uVar33;
    len._5_1_ = 0;
    len._6_2_ = (undefined2)zip->entry_flags;
    bVar35 = (zip->entry_encryption & ~ENCRYPTION_TRADITIONAL) != ENCRYPTION_WINZIP_AES128;
    local_100 = 99;
    if (bVar35) {
      local_100 = (undefined1)uVar28;
    }
    local_ff = (undefined1)((ushort)uVar28 >> 8);
    if (!bVar35) {
      local_ff = 0;
    }
    len._4_1_ = uVar32;
    archive_entry_mtime(zip->entry);
    local_fe = dos_time(CONCAT44(iVar37,in_stack_fffffffffffffee8));
    uVar3 = zip->entry_crc32;
    local_fa = (undefined2)uVar3;
    uStack_f8 = (undefined2)(uVar3 >> 0x10);
    if (zip->entry_uses_zip64 == 0) {
      uStack_f6 = (undefined4)zip->entry_compressed_size;
      iVar27 = zip->entry_uncompressed_size;
      uStack_f1 = (undefined1)((ulong)iVar27 >> 8);
      uStack_f0 = (undefined1)((ulong)iVar27 >> 0x10);
      uStack_ef = (undefined1)((ulong)iVar27 >> 0x18);
    }
    else {
      uStack_f6 = 0xffffffff;
      iVar27 = 0xff;
      uStack_f1 = 0xff;
      uStack_f0 = 0xff;
      uStack_ef = 0xff;
    }
    uStack_f2 = (undefined1)iVar27;
    uVar4 = (uchar)(sVar19 >> 8);
    if (zip->entry_encryption == ENCRYPTION_TRADITIONAL) {
      uVar6 = (uchar)(local_fe >> 8);
      if ((zip->entry_flags & 8) == 0) {
        uVar6 = (uchar)(uVar3 >> 0x18);
      }
      zip->trad_chkdat = uVar6;
    }
    uStack_ee = (uchar)sVar19;
    uStack_ed = uVar4;
    pauVar21 = (undefined1 (*) [16])cd_alloc(zip,0x2e);
    zip->file_header = (uchar *)pauVar21;
    zip->central_directory_entries = zip->central_directory_entries + 1;
    *pauVar21 = (undefined1  [16])0x0;
    pauVar21[1] = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pauVar21[1] + 0xe) = (undefined1  [16])0x0;
    builtin_memcpy(zip->file_header,"PK\x01\x02",4);
    puVar22 = zip->file_header;
    puVar22[4] = uVar32;
    puVar22[5] = '\x03';
    puVar22 = zip->file_header;
    puVar22[6] = uVar32;
    puVar22[7] = '\0';
    *(short *)(zip->file_header + 8) = (short)zip->entry_flags;
    puVar22 = zip->file_header;
    local_e0 = (int64_t *)CONCAT44(local_e0._4_4_,uVar33);
    if ((zip->entry_encryption & ~ENCRYPTION_TRADITIONAL) == ENCRYPTION_WINZIP_AES128) {
      puVar22[10] = 'c';
      uVar32 = '\0';
    }
    else {
      cVar29 = zip->entry_compression;
      puVar22[10] = (uchar)cVar29;
      uVar32 = (uchar)((uint)cVar29 >> 8);
    }
    puVar22[0xb] = uVar32;
    puVar22 = zip->file_header;
    local_d0 = sVar20;
    archive_entry_mtime(zip->entry);
    uVar11 = dos_time(CONCAT44(iVar37,in_stack_fffffffffffffee8));
    *(uint *)(puVar22 + 0xc) = uVar11;
    puVar22 = zip->file_header;
    puVar22[0x1c] = (uchar)sVar19;
    puVar22[0x1d] = uVar4;
    puVar22 = zip->file_header;
    mVar7 = archive_entry_mode(zip->entry);
    puVar22[0x26] = '\0';
    puVar22[0x27] = '\0';
    puVar22[0x28] = (uchar)mVar7;
    puVar22[0x29] = (uchar)(mVar7 >> 8);
    puVar22 = cd_alloc(zip,sVar19);
    paVar16 = zip->entry;
    pcVar25 = archive_entry_pathname(paVar16);
    sVar19 = strlen(pcVar25);
    mVar7 = archive_entry_filetype(paVar16);
    memcpy(puVar22,pcVar25,sVar19);
    if ((mVar7 == 0x4000) && (pcVar25[sVar19 - 1] != '/')) {
      puVar22[sVar19] = '/';
    }
    memset(local_extra,0,0x90);
    local_extra[0] = 'U';
    local_extra[1] = 'T';
    wVar8 = archive_entry_mtime_is_set(entry);
    wVar12 = archive_entry_atime_is_set(entry);
    wVar13 = archive_entry_ctime_is_set(entry);
    local_extra[2] =
         (wVar13 != L'\0') * '\x04' + (wVar12 != L'\0') * '\x04' + (wVar8 != L'\0') * '\x04' +
         '\x01';
    local_extra[3] = '\0';
    wVar8 = archive_entry_mtime_is_set(entry);
    wVar12 = archive_entry_atime_is_set(entry);
    wVar13 = archive_entry_ctime_is_set(entry);
    local_extra[4] = (wVar13 != L'\0') << 2 | (wVar12 != L'\0') * '\x02' | wVar8 != L'\0';
    wVar8 = archive_entry_mtime_is_set(entry);
    if (wVar8 == L'\0') {
      puVar22 = local_extra + 5;
    }
    else {
      tVar23 = archive_entry_mtime(entry);
      puVar22 = local_extra + 9;
      local_extra._5_3_ = (undefined3)tVar23;
      local_extra[8] = (uchar)((ulong)tVar23 >> 0x18);
    }
    wVar8 = archive_entry_atime_is_set(entry);
    if (wVar8 != L'\0') {
      tVar23 = archive_entry_atime(entry);
      *(int *)puVar22 = (int)tVar23;
      puVar22 = puVar22 + 4;
    }
    wVar8 = archive_entry_ctime_is_set(entry);
    if (wVar8 != L'\0') {
      tVar23 = archive_entry_ctime(entry);
      *(int *)puVar22 = (int)tVar23;
      puVar22 = puVar22 + 4;
    }
    puVar22[0] = 'u';
    puVar22[1] = 'x';
    puVar22[2] = '\v';
    puVar22[3] = '\0';
    puVar22[4] = '\x01';
    puVar22[5] = '\x04';
    lVar14 = archive_entry_uid(entry);
    puVar22[6] = (uchar)lVar14;
    puVar22[7] = (uchar)((ulong)lVar14 >> 8);
    puVar22[8] = (uchar)((ulong)lVar14 >> 0x10);
    puVar22[9] = (uchar)((ulong)lVar14 >> 0x18);
    puVar22[10] = '\x04';
    lVar14 = archive_entry_gid(entry);
    *(int *)(puVar22 + 0xb) = (int)lVar14;
    puVar30 = puVar22 + 0xf;
    if (((zip->entry_flags & 1) != 0) &&
       ((zip->entry_encryption & ~ENCRYPTION_TRADITIONAL) == ENCRYPTION_WINZIP_AES128)) {
      puVar30[0] = '\x01';
      puVar30[1] = 0x99;
      puVar30[2] = '\a';
      puVar30[3] = '\0';
      puVar30[4] = '\x01';
      puVar30[5] = '\0';
      puVar30[6] = 'A';
      puVar30[7] = 'E';
      wVar8 = archive_entry_size_is_set(zip->entry);
      uVar11 = 1;
      if ((wVar8 != L'\0') && (lVar14 = archive_entry_size(zip->entry), lVar14 < 0x14)) {
        puVar22[0x13] = '\x02';
        puVar22[0x14] = '\0';
        uVar11 = 2;
      }
      zip->aes_vendor = uVar11;
      puVar22[0x17] = (zip->entry_encryption != ENCRYPTION_WINZIP_AES128) * '\x02' + '\x01';
      *(short *)(puVar22 + 0x18) = (short)zip->entry_compression;
      puVar30 = puVar22 + 0x1a;
    }
    zip->file_header_extra_offset = zip->central_directory_bytes;
    sVar31 = (long)puVar30 - (long)local_extra;
    puVar22 = cd_alloc(zip,sVar31);
    memcpy(puVar22,local_extra,sVar31);
    if (zip->entry_uses_zip64 != 0) {
      puVar30[0] = '\x01';
      puVar30[1] = '\0';
      puVar30[2] = '\x10';
      puVar30[3] = '\0';
      archive_le64enc(puVar30 + 4,zip->entry_uncompressed_size);
      archive_le64enc(puVar30 + 0xc,zip->entry_compressed_size);
      puVar30[2] = '\x10';
      puVar30[3] = '\0';
      puVar30 = puVar30 + 0x14;
    }
    if ((zip->flags & 4) != 0) {
      puVar30[0] = 'x';
      puVar30[1] = 'l';
      puVar30[2] = '\0';
      puVar30[3] = '\0';
      puVar30[4] = '\a';
      puVar30[5] = (uchar)local_e0;
      puVar30[6] = '\x03';
      puVar30[7] = '\0';
      puVar30[8] = '\0';
      mVar7 = archive_entry_mode(zip->entry);
      puVar30[9] = '\0';
      puVar30[10] = '\0';
      puVar30[0xb] = (uchar)mVar7;
      puVar30[0xc] = (uchar)(mVar7 >> 8);
      puVar30[2] = '\t';
      puVar30[3] = '\0';
      puVar30 = puVar30 + 0xd;
    }
    sVar31 = (long)puVar30 - (long)local_extra;
    uStack_ec = (undefined2)sVar31;
    iVar9 = __archive_write_output(local_d8,&len,0x1e);
    if (iVar9 != 0) {
      return -0x1e;
    }
    zip->written_bytes = zip->written_bytes + 0x1e;
    paVar16 = zip->entry;
    pcVar25 = archive_entry_pathname(paVar16);
    mVar7 = archive_entry_filetype(paVar16);
    if (pcVar25 == (char *)0x0) {
      return -0x1e;
    }
    sVar19 = strlen(pcVar25);
    iVar9 = __archive_write_output(local_d8,pcVar25,sVar19);
    if (iVar9 != 0) {
      return -0x1e;
    }
    sVar19 = strlen(pcVar25);
    if ((mVar7 == 0x4000) && (pcVar25[sVar19 - 1] != '/')) {
      iVar9 = __archive_write_output(local_d8,"/",1);
      if (iVar9 != 0) {
        return -0x1e;
      }
      sVar19 = sVar19 + 1;
    }
    a = local_d8;
    if ((int)(uint)sVar19 < 1) {
      return -0x1e;
    }
    zip->written_bytes = zip->written_bytes + (ulong)((uint)sVar19 & 0x7fffffff);
    iVar9 = __archive_write_output(local_d8,local_extra,sVar31);
    sVar5 = local_d0;
    if (iVar9 != 0) {
      return -0x1e;
    }
    zip->written_bytes = zip->written_bytes + sVar31;
    if (local_110 != (char *)0x0) {
      iVar9 = __archive_write_output(a,local_110,local_d0);
      if (iVar9 != 0) {
        return -0x1e;
      }
      auVar36._8_4_ = (int)sVar5;
      auVar36._0_8_ = sVar5;
      auVar36._12_4_ = (int)(sVar5 >> 0x20);
      zip->entry_compressed_written = sVar5 + zip->entry_compressed_written;
      zip->entry_uncompressed_written = auVar36._8_8_ + zip->entry_uncompressed_written;
      zip->written_bytes = zip->written_bytes + sVar5;
    }
    if (zip->entry_compression != COMPRESSION_DEFLATE) {
      return iVar37;
    }
    (zip->stream).zalloc = (alloc_func)0x0;
    (zip->stream).zfree = (free_func)0x0;
    (zip->stream).opaque = (voidpf)0x0;
    (zip->stream).next_out = zip->buf;
    iVar9 = zip->deflate_compression_level;
    (zip->stream).avail_out = (uInt)zip->len_buf;
    iVar9 = cm_zlib_deflateInit2_(&zip->stream,iVar9,8,-0xf,8,0,"1.2.12",0x70);
    if (iVar9 == 0) {
      return iVar37;
    }
    pcVar25 = "Can\'t init deflate compressor";
  }
LAB_004ab9e3:
  archive_set_error(&a->archive,0xc,pcVar25);
  return -0x1e;
}

Assistant:

static int
archive_write_zip_header(struct archive_write *a, struct archive_entry *entry)
{
	unsigned char local_header[32];
	unsigned char local_extra[144];
	struct zip *zip = a->format_data;
	unsigned char *e;
	unsigned char *cd_extra;
	size_t filename_length;
	const char *slink = NULL;
	size_t slink_size = 0;
	struct archive_string_conv *sconv = get_sconv(a, zip);
	int ret, ret2 = ARCHIVE_OK;
	mode_t type;
	int version_needed = 10;

	/* Ignore types of entries that we don't support. */
	type = archive_entry_filetype(entry);
	if (type != AE_IFREG && type != AE_IFDIR && type != AE_IFLNK) {
		__archive_write_entry_filetype_unsupported(
		    &a->archive, entry, "zip");
		return ARCHIVE_FAILED;
	};

	/* If we're not using Zip64, reject large files. */
	if (zip->flags & ZIP_FLAG_AVOID_ZIP64) {
		/* Reject entries over 4GB. */
		if (archive_entry_size_is_set(entry)
		    && (archive_entry_size(entry) > ZIP_4GB_MAX)) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Files > 4GB require Zip64 extensions");
			return ARCHIVE_FAILED;
		}
		/* Reject entries if archive is > 4GB. */
		if (zip->written_bytes > ZIP_4GB_MAX) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Archives > 4GB require Zip64 extensions");
			return ARCHIVE_FAILED;
		}
	}

	/* Only regular files can have size > 0. */
	if (type != AE_IFREG)
		archive_entry_set_size(entry, 0);


	/* Reset information from last entry. */
	zip->entry_offset = zip->written_bytes;
	zip->entry_uncompressed_limit = INT64_MAX;
	zip->entry_compressed_size = 0;
	zip->entry_uncompressed_size = 0;
	zip->entry_compressed_written = 0;
	zip->entry_uncompressed_written = 0;
	zip->entry_flags = 0;
	zip->entry_uses_zip64 = 0;
	zip->entry_crc32 = zip->crc32func(0, NULL, 0);
	zip->entry_encryption = 0;
	archive_entry_free(zip->entry);
	zip->entry = NULL;

	if (zip->cctx_valid)
		archive_encrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	zip->tctx_valid = zip->cctx_valid = zip->hctx_valid = 0;

	if (type == AE_IFREG
		    &&(!archive_entry_size_is_set(entry)
			|| archive_entry_size(entry) > 0)) {
		switch (zip->encryption_type) {
		case ENCRYPTION_TRADITIONAL:
		case ENCRYPTION_WINZIP_AES128:
		case ENCRYPTION_WINZIP_AES256:
			zip->entry_flags |= ZIP_ENTRY_FLAG_ENCRYPTED;
			zip->entry_encryption = zip->encryption_type;
			break;
		case ENCRYPTION_NONE:
		default:
			break;
		}
	}


#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	zip->entry = __la_win_entry_in_posix_pathseparator(entry);
	if (zip->entry == entry)
		zip->entry = archive_entry_clone(entry);
#else
	zip->entry = archive_entry_clone(entry);
#endif
	if (zip->entry == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate zip header data");
		return (ARCHIVE_FATAL);
	}

	if (sconv != NULL) {
		const char *p;
		size_t len;

		if (archive_entry_pathname_l(entry, &p, &len, sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Pathname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate Pathname '%s' to %s",
			    archive_entry_pathname(entry),
			    archive_string_conversion_charset_name(sconv));
			ret2 = ARCHIVE_WARN;
		}
		if (len > 0)
			archive_entry_set_pathname(zip->entry, p);

		/*
		 * There is no standard for symlink handling; we convert
		 * it using the same character-set translation that we use
		 * for filename.
		 */
		if (type == AE_IFLNK) {
			if (archive_entry_symlink_l(entry, &p, &len, sconv)) {
				if (errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory "
					    " for Symlink");
					return (ARCHIVE_FATAL);
				}
				/* No error if we can't convert. */
			} else if (len > 0)
				archive_entry_set_symlink(zip->entry, p);
		}
	}

	/* If filename isn't ASCII and we can use UTF-8, set the UTF-8 flag. */
	if (!is_all_ascii(archive_entry_pathname(zip->entry))) {
		if (zip->opt_sconv != NULL) {
			if (strcmp(archive_string_conversion_charset_name(
					zip->opt_sconv), "UTF-8") == 0)
				zip->entry_flags |= ZIP_ENTRY_FLAG_UTF8_NAME;
#if HAVE_NL_LANGINFO
		} else if (strcmp(nl_langinfo(CODESET), "UTF-8") == 0) {
			zip->entry_flags |= ZIP_ENTRY_FLAG_UTF8_NAME;
#endif
		}
	}
	filename_length = path_length(zip->entry);

	/* Determine appropriate compression and size for this entry. */
	if (type == AE_IFLNK) {
		slink = archive_entry_symlink(zip->entry);
		if (slink != NULL)
			slink_size = strlen(slink);
		else
			slink_size = 0;
		zip->entry_uncompressed_limit = slink_size;
		zip->entry_compressed_size = slink_size;
		zip->entry_uncompressed_size = slink_size;
		zip->entry_crc32 = zip->crc32func(zip->entry_crc32,
		    (const unsigned char *)slink, slink_size);
		zip->entry_compression = COMPRESSION_STORE;
		version_needed = 20;
	} else if (type != AE_IFREG) {
		zip->entry_compression = COMPRESSION_STORE;
		zip->entry_uncompressed_limit = 0;
		version_needed = 20;
	} else if (archive_entry_size_is_set(zip->entry)) {
		int64_t size = archive_entry_size(zip->entry);
		int64_t additional_size = 0;

		zip->entry_uncompressed_limit = size;
		zip->entry_compression = zip->requested_compression;
		if (zip->entry_compression == COMPRESSION_UNSPECIFIED) {
			zip->entry_compression = COMPRESSION_DEFAULT;
		}
		if (zip->entry_compression == COMPRESSION_STORE) {
			zip->entry_compressed_size = size;
			zip->entry_uncompressed_size = size;
			version_needed = 10;
		} else {
			zip->entry_uncompressed_size = size;
			version_needed = 20;
		}

		if (zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED) {
			switch (zip->entry_encryption) {
			case ENCRYPTION_TRADITIONAL:
				additional_size = TRAD_HEADER_SIZE;
				version_needed = 20;
				break;
			case ENCRYPTION_WINZIP_AES128:
				additional_size = WINZIP_AES128_HEADER_SIZE
				    + AUTH_CODE_SIZE;
				version_needed = 20;
				break;
			case ENCRYPTION_WINZIP_AES256:
				additional_size = WINZIP_AES256_HEADER_SIZE
				    + AUTH_CODE_SIZE;
				version_needed = 20;
				break;
			case ENCRYPTION_NONE:
			default:
				break;
			}
			if (zip->entry_compression == COMPRESSION_STORE)
				zip->entry_compressed_size += additional_size;
		}

		/*
		 * Set Zip64 extension in any of the following cases
		 * (this was suggested by discussion on info-zip-dev
		 * mailing list):
		 *  = Zip64 is being forced by user
		 *  = File is over 4GiB uncompressed
		 *    (including encryption header, if any)
		 *  = File is close to 4GiB and is being compressed
		 *    (compression might make file larger)
		 */
		if ((zip->flags & ZIP_FLAG_FORCE_ZIP64)
		    || (zip->entry_uncompressed_size + additional_size > ZIP_4GB_MAX)
		    || (zip->entry_uncompressed_size > ZIP_4GB_MAX_UNCOMPRESSED
			&& zip->entry_compression != COMPRESSION_STORE)) {
			zip->entry_uses_zip64 = 1;
			version_needed = 45;
		}

		/* We may know the size, but never the CRC. */
		zip->entry_flags |= ZIP_ENTRY_FLAG_LENGTH_AT_END;
	} else {
		/* We don't know the size. Use the default
		 * compression unless specified otherwise.
		 * We enable Zip64 extensions unless we're told not to.
		 */

		zip->entry_compression = zip->requested_compression;
		if(zip->entry_compression == COMPRESSION_UNSPECIFIED){
			zip->entry_compression = COMPRESSION_DEFAULT;
		}

		zip->entry_flags |= ZIP_ENTRY_FLAG_LENGTH_AT_END;
		if ((zip->flags & ZIP_FLAG_AVOID_ZIP64) == 0) {
			zip->entry_uses_zip64 = 1;
			version_needed = 45;
		} else if (zip->entry_compression == COMPRESSION_STORE) {
			version_needed = 10;
		} else {
			version_needed = 20;
		}

		if (zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED) {
			switch (zip->entry_encryption) {
			case ENCRYPTION_TRADITIONAL:
			case ENCRYPTION_WINZIP_AES128:
			case ENCRYPTION_WINZIP_AES256:
				if (version_needed < 20)
					version_needed = 20;
				break;
			case ENCRYPTION_NONE:
			default:
				break;
			}
		}
	}

	/* Format the local header. */
	memset(local_header, 0, sizeof(local_header));
	memcpy(local_header, "PK\003\004", 4);
	archive_le16enc(local_header + 4, version_needed);
	archive_le16enc(local_header + 6, zip->entry_flags);
	if (zip->entry_encryption == ENCRYPTION_WINZIP_AES128
	    || zip->entry_encryption == ENCRYPTION_WINZIP_AES256)
		archive_le16enc(local_header + 8, WINZIP_AES_ENCRYPTION);
	else
		archive_le16enc(local_header + 8, zip->entry_compression);
	archive_le32enc(local_header + 10,
		dos_time(archive_entry_mtime(zip->entry)));
	archive_le32enc(local_header + 14, zip->entry_crc32);
	if (zip->entry_uses_zip64) {
		/* Zip64 data in the local header "must" include both
		 * compressed and uncompressed sizes AND those fields
		 * are included only if these are 0xffffffff;
		 * THEREFORE these must be set this way, even if we
		 * know one of them is smaller. */
		archive_le32enc(local_header + 18, ZIP_4GB_MAX);
		archive_le32enc(local_header + 22, ZIP_4GB_MAX);
	} else {
		archive_le32enc(local_header + 18, (uint32_t)zip->entry_compressed_size);
		archive_le32enc(local_header + 22, (uint32_t)zip->entry_uncompressed_size);
	}
	archive_le16enc(local_header + 26, (uint16_t)filename_length);

	if (zip->entry_encryption == ENCRYPTION_TRADITIONAL) {
		if (zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END)
			zip->trad_chkdat = local_header[11];
		else
			zip->trad_chkdat = local_header[17];
	}

	/* Format as much of central directory file header as we can: */
	zip->file_header = cd_alloc(zip, 46);
	/* If (zip->file_header == NULL) XXXX */
	++zip->central_directory_entries;
	memset(zip->file_header, 0, 46);
	memcpy(zip->file_header, "PK\001\002", 4);
	/* "Made by PKZip 2.0 on Unix." */
	archive_le16enc(zip->file_header + 4, 3 * 256 + version_needed);
	archive_le16enc(zip->file_header + 6, version_needed);
	archive_le16enc(zip->file_header + 8, zip->entry_flags);
	if (zip->entry_encryption == ENCRYPTION_WINZIP_AES128
	    || zip->entry_encryption == ENCRYPTION_WINZIP_AES256)
		archive_le16enc(zip->file_header + 10, WINZIP_AES_ENCRYPTION);
	else
		archive_le16enc(zip->file_header + 10, zip->entry_compression);
	archive_le32enc(zip->file_header + 12,
		dos_time(archive_entry_mtime(zip->entry)));
	archive_le16enc(zip->file_header + 28, (uint16_t)filename_length);
	/* Following Info-Zip, store mode in the "external attributes" field. */
	archive_le32enc(zip->file_header + 38,
	    ((uint32_t)archive_entry_mode(zip->entry)) << 16);
	e = cd_alloc(zip, filename_length);
	/* If (e == NULL) XXXX */
	copy_path(zip->entry, e);

	/* Format extra data. */
	memset(local_extra, 0, sizeof(local_extra));
	e = local_extra;

	/* First, extra blocks that are the same between
	 * the local file header and the central directory.
	 * We format them once and then duplicate them. */

	/* UT timestamp, length depends on what timestamps are set. */
	memcpy(e, "UT", 2);
	archive_le16enc(e + 2,
	    1
	    + (archive_entry_mtime_is_set(entry) ? 4 : 0)
	    + (archive_entry_atime_is_set(entry) ? 4 : 0)
	    + (archive_entry_ctime_is_set(entry) ? 4 : 0));
	e += 4;
	*e++ =
	    (archive_entry_mtime_is_set(entry) ? 1 : 0)
	    | (archive_entry_atime_is_set(entry) ? 2 : 0)
	    | (archive_entry_ctime_is_set(entry) ? 4 : 0);
	if (archive_entry_mtime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_mtime(entry));
		e += 4;
	}
	if (archive_entry_atime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_atime(entry));
		e += 4;
	}
	if (archive_entry_ctime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_ctime(entry));
		e += 4;
	}

	/* ux Unix extra data, length 11, version 1 */
	/* TODO: If uid < 64k, use 2 bytes, ditto for gid. */
	memcpy(e, "ux\013\000\001", 5);
	e += 5;
	*e++ = 4; /* Length of following UID */
	archive_le32enc(e, (uint32_t)archive_entry_uid(entry));
	e += 4;
	*e++ = 4; /* Length of following GID */
	archive_le32enc(e, (uint32_t)archive_entry_gid(entry));
	e += 4;

	/* AES extra data field: WinZIP AES information, ID=0x9901 */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED)
	    && (zip->entry_encryption == ENCRYPTION_WINZIP_AES128
	        || zip->entry_encryption == ENCRYPTION_WINZIP_AES256)) {

		memcpy(e, "\001\231\007\000\001\000AE", 8);
		/* AES vendor version AE-2 does not store a CRC.
		 * WinZip 11 uses AE-1, which does store the CRC,
		 * but it does not store the CRC when the file size
		 * is less than 20 bytes. So we simulate what
		 * WinZip 11 does.
		 * NOTE: WinZip 9.0 and 10.0 uses AE-2 by default. */
		if (archive_entry_size_is_set(zip->entry)
		    && archive_entry_size(zip->entry) < 20) {
			archive_le16enc(e+4, AES_VENDOR_AE_2);
			zip->aes_vendor = AES_VENDOR_AE_2;/* no CRC. */
		} else
			zip->aes_vendor = AES_VENDOR_AE_1;
		e += 8;
		/* AES encryption strength. */
		*e++ = (zip->entry_encryption == ENCRYPTION_WINZIP_AES128)?1:3;
		/* Actual compression method. */
		archive_le16enc(e, zip->entry_compression);
		e += 2;
	}

	/* Copy UT ,ux, and AES-extra into central directory as well. */
	zip->file_header_extra_offset = zip->central_directory_bytes;
	cd_extra = cd_alloc(zip, e - local_extra);
	memcpy(cd_extra, local_extra, e - local_extra);

	/*
	 * Following extra blocks vary between local header and
	 * central directory. These are the local header versions.
	 * Central directory versions get formatted in
	 * archive_write_zip_finish_entry() below.
	 */

	/* "[Zip64 entry] in the local header MUST include BOTH
	 * original [uncompressed] and compressed size fields." */
	if (zip->entry_uses_zip64) {
		unsigned char *zip64_start = e;
		memcpy(e, "\001\000\020\000", 4);
		e += 4;
		archive_le64enc(e, zip->entry_uncompressed_size);
		e += 8;
		archive_le64enc(e, zip->entry_compressed_size);
		e += 8;
		archive_le16enc(zip64_start + 2, (uint16_t)(e - (zip64_start + 4)));
	}

	if (zip->flags & ZIP_FLAG_EXPERIMENT_xl) {
		/* Experimental 'xl' extension to improve streaming. */
		unsigned char *external_info = e;
		int included = 7;
		memcpy(e, "xl\000\000", 4); // 0x6c65 + 2-byte length
		e += 4;
		e[0] = included; /* bitmap of included fields */
		e += 1;
		if (included & 1) {
			archive_le16enc(e, /* "Version created by" */
			    3 * 256 + version_needed);
			e += 2;
		}
		if (included & 2) {
			archive_le16enc(e, 0); /* internal file attributes */
			e += 2;
		}
		if (included & 4) {
			archive_le32enc(e,  /* external file attributes */
			    ((uint32_t)archive_entry_mode(zip->entry)) << 16);
			e += 4;
		}
		if (included & 8) {
			// Libarchive does not currently support file comments.
		}
		archive_le16enc(external_info + 2, (uint16_t)(e - (external_info + 4)));
	}

	/* Update local header with size of extra data and write it all out: */
	archive_le16enc(local_header + 28, (uint16_t)(e - local_extra));

	ret = __archive_write_output(a, local_header, 30);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += 30;

	ret = write_path(zip->entry, a);
	if (ret <= ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += ret;

	ret = __archive_write_output(a, local_extra, e - local_extra);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += e - local_extra;

	/* For symlinks, write the body now. */
	if (slink != NULL) {
		ret = __archive_write_output(a, slink, slink_size);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		zip->entry_compressed_written += slink_size;
		zip->entry_uncompressed_written += slink_size;
		zip->written_bytes += slink_size;
	}

#ifdef HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		zip->stream.zalloc = Z_NULL;
		zip->stream.zfree = Z_NULL;
		zip->stream.opaque = Z_NULL;
		zip->stream.next_out = zip->buf;
		zip->stream.avail_out = (uInt)zip->len_buf;
		if (deflateInit2(&zip->stream, zip->deflate_compression_level,
		    Z_DEFLATED, -15, 8, Z_DEFAULT_STRATEGY) != Z_OK) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't init deflate compressor");
			return (ARCHIVE_FATAL);
		}
	}
#endif

	return (ret2);
}